

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::CategoricalCrossEntropyLossLayer::MergeFrom
          (CategoricalCrossEntropyLossLayer *this,CategoricalCrossEntropyLossLayer *from)

{
  LogMessage *other;
  ulong uVar1;
  CategoricalCrossEntropyLossLayer *pCVar2;
  Arena *pAVar3;
  string *psVar4;
  LogFinisher local_85;
  uint32_t cached_has_bits;
  byte local_71;
  LogMessage local_70;
  CategoricalCrossEntropyLossLayer *local_38;
  CategoricalCrossEntropyLossLayer *from_local;
  CategoricalCrossEntropyLossLayer *this_local;
  CategoricalCrossEntropyLossLayer *local_20;
  string *local_18;
  CategoricalCrossEntropyLossLayer *local_10;
  
  local_71 = 0;
  local_38 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/NeuralNetwork.pb.cc"
               ,0xe932);
    local_71 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_70,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_85,other);
  }
  if ((local_71 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_70);
  }
  _internal_input_abi_cxx11_(local_38);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    pCVar2 = (CategoricalCrossEntropyLossLayer *)_internal_input_abi_cxx11_(local_38);
    this_local = pCVar2;
    local_20 = this;
    pAVar3 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Set(&this->input_,pCVar2,pAVar3);
  }
  _internal_target_abi_cxx11_(local_38);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    psVar4 = _internal_target_abi_cxx11_(local_38);
    local_18 = psVar4;
    local_10 = this;
    pAVar3 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Set(&this->target_,psVar4,pAVar3);
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(local_38->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void CategoricalCrossEntropyLossLayer::MergeFrom(const CategoricalCrossEntropyLossLayer& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.CategoricalCrossEntropyLossLayer)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (!from._internal_input().empty()) {
    _internal_set_input(from._internal_input());
  }
  if (!from._internal_target().empty()) {
    _internal_set_target(from._internal_target());
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}